

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::Write<long>::set(Write<long> *this,LO i,long value)

{
  ScopedTimer local_41;
  long lStack_40;
  ScopedTimer timer;
  long value_local;
  LO i_local;
  Write<long> *this_local;
  
  lStack_40 = value;
  ScopedTimer::ScopedTimer(&local_41,"single host to device",(char *)0x0);
  *(long *)((long)(this->shared_alloc_).direct_ptr + (long)i * 8) = lStack_40;
  ScopedTimer::~ScopedTimer(&local_41);
  return;
}

Assistant:

void Write<T>::set(LO i, T value) const {
  ScopedTimer timer("single host to device");
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK(0 <= i);
    OMEGA_H_CHECK(i < size());
#endif
#ifdef OMEGA_H_USE_CUDA
  cudaMemcpy(data() + i, &value, sizeof(T), cudaMemcpyHostToDevice);
#else
  operator[](i) = value;
#endif
}